

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall S2Builder::ChooseInitialSites(S2Builder *this,S2PointIndex<int> *site_index)

{
  pointer pRVar1;
  bool bVar2;
  int iVar3;
  Result *result;
  D *point;
  pointer pRVar4;
  InputVertexKey *key;
  pointer ppVar5;
  int local_46c;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  results;
  _Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> local_430;
  S2Point site;
  Target local_400;
  VType local_3f8;
  VType VStack_3f0;
  VType local_3e8;
  S2ClosestPointQueryOptions options;
  S2ClosestPointQuery<int> site_query;
  
  S2ClosestPointQueryBaseOptions<S2MinDistance>::S2ClosestPointQueryBaseOptions
            (&options.super_S2ClosestPointQueryBaseOptions<S2MinDistance>);
  S2ClosestPointQueryOptions::set_conservative_max_distance
            ((S2ClosestPointQueryOptions *)
             &options.super_S2ClosestPointQueryBaseOptions<S2MinDistance>,
             (S1ChordAngle)(this->min_site_separation_ca_).length2_);
  S2ClosestPointQuery<int>::S2ClosestPointQuery
            (&site_query,site_index,
             (Options_conflict *)&options.super_S2ClosestPointQueryBaseOptions<S2MinDistance>);
  results.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  results.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SortInputVertices((vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> *)
                    &local_430,this);
  for (ppVar5 = local_430._M_impl.super__Vector_impl_data._M_start;
      ppVar5 != local_430._M_impl.super__Vector_impl_data._M_finish; ppVar5 = ppVar5 + 1) {
    point = (this->input_vertices_).
            super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
            super__Vector_impl_data._M_start + ppVar5->second;
    SnapSite(&site,this,point);
    bVar2 = true;
    if (this->snapping_needed_ == false) {
      bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                        ((BasicVector<Vector3,_double,_3UL> *)&site,point);
    }
    this->snapping_needed_ = bVar2;
    local_3e8 = site.c_[2];
    local_3f8 = site.c_[0];
    VStack_3f0 = site.c_[1];
    local_400._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_00304ca0;
    S2ClosestPointQuery<int>::FindClosestPoints(&site_query,&local_400,&results);
    pRVar1 = results.
             super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
    for (pRVar4 = results.
                  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1)
    {
      iVar3 = s2pred::CompareDistance
                        (&site,&(pRVar4->point_data_->tuple_).
                                super__Tuple_impl<0UL,_Vector3<double>,_int>.
                                super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl,
                         (S1ChordAngle)(this->min_site_separation_ca_).length2_);
      if (iVar3 < 1) {
        bVar2 = true;
        if (this->snapping_needed_ == false) {
          bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                            ((BasicVector<Vector3,_double,_3UL> *)&site,
                             &(pRVar4->point_data_->tuple_).
                              super__Tuple_impl<0UL,_Vector3<double>,_int>.
                              super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl);
        }
        this->snapping_needed_ = bVar2;
        bVar2 = false;
      }
    }
    if (bVar2) {
      local_46c = (int)(((long)(this->sites_).
                               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->sites_).
                              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      S2PointIndex<int>::Add(site_index,&site,&local_46c);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                (&this->sites_,(value_type *)&site);
      S2ClosestPointQueryBase<S2MinDistance,_int>::ReInit(&site_query.base_);
    }
  }
  std::_Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::
  ~_Vector_base(&local_430);
  std::
  _Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ::~_Vector_base(&results.
                   super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                 );
  S2ClosestPointQueryBase<S2MinDistance,_int>::~S2ClosestPointQueryBase(&site_query.base_);
  return;
}

Assistant:

void S2Builder::ChooseInitialSites(S2PointIndex<SiteId>* site_index) {
  // Find all points whose distance is <= min_site_separation_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(min_site_separation_ca_);
  S2ClosestPointQuery<SiteId> site_query(site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;

  // Apply the snap_function() to each input vertex, then check whether any
  // existing site is closer than min_vertex_separation().  If not, then add a
  // new site.
  //
  // NOTE(ericv): There are actually two reasonable algorithms, which we call
  // "snap first" (the one above) and "snap last".  The latter checks for each
  // input vertex whether any existing site is closer than snap_radius(), and
  // only then applies the snap_function() and adds a new site.  "Snap last"
  // can yield slightly fewer sites in some cases, but it is also more
  // expensive and can produce surprising results.  For example, if you snap
  // the polyline "0:0, 0:0.7" using IntLatLngSnapFunction(0), the result is
  // "0:0, 0:0" rather than the expected "0:0, 0:1", because the snap radius
  // is approximately sqrt(2) degrees and therefore it is legal to snap both
  // input points to "0:0".  "Snap first" produces "0:0, 0:1" as expected.
  for (const InputVertexKey& key : SortInputVertices()) {
    const S2Point& vertex = input_vertices_[key.second];
    S2Point site = SnapSite(vertex);
    // If any vertex moves when snapped, the output cannot be idempotent.
    snapping_needed_ = snapping_needed_ || site != vertex;

    // FindClosestPoints() measures distances conservatively, so we need to
    // recheck the distances using exact predicates.
    //
    // NOTE(ericv): When the snap radius is large compared to the average
    // vertex spacing, we could possibly avoid the call the FindClosestPoints
    // by checking whether sites_.back() is close enough.
    S2ClosestPointQueryPointTarget target(site);
    site_query.FindClosestPoints(&target, &results);
    bool add_site = true;
    for (const auto& result : results) {
      if (s2pred::CompareDistance(site, result.point(),
                                  min_site_separation_ca_) <= 0) {
        add_site = false;
        // This pair of sites is too close.  If the sites are distinct, then
        // the output cannot be idempotent.
        snapping_needed_ = snapping_needed_ || site != result.point();
      }
    }
    if (add_site) {
      site_index->Add(site, sites_.size());
      sites_.push_back(site);
      site_query.ReInit();
    }
  }
}